

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

Cnf_Dat_t * Jf_ManCreateCnfRemap(Gia_Man_t *p,Vec_Int_t *vLits,Vec_Int_t *vClas,int fAddOrCla)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *pMap_00;
  Cnf_Dat_t *pCVar3;
  int **ppiVar4;
  int *piVar5;
  bool bVar6;
  int local_4c;
  int nVars;
  int *pMap;
  int Entry;
  int i;
  Gia_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  int fAddOrCla_local;
  Vec_Int_t *vClas_local;
  Vec_Int_t *vLits_local;
  Gia_Man_t *p_local;
  
  local_4c = 0;
  if (fAddOrCla != 0) {
    iVar1 = Vec_IntSize(vLits);
    Vec_IntPush(vClas,iVar1);
    pMap._4_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar6 = false;
      if (pMap._4_4_ < iVar1) {
        _Entry = Gia_ManCo(p,pMap._4_4_);
        bVar6 = _Entry != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjId(p,_Entry);
      iVar1 = Abc_Var2Lit(iVar1,0);
      Vec_IntPush(vLits,iVar1);
      pMap._4_4_ = pMap._4_4_ + 1;
    }
  }
  for (pMap._4_4_ = 0; iVar1 = Vec_IntSize(vLits), pMap._4_4_ < iVar1; pMap._4_4_ = pMap._4_4_ + 1)
  {
    iVar1 = Vec_IntEntry(vLits,pMap._4_4_);
    iVar1 = Abc_Lit2Var(iVar1);
    pGVar2 = Gia_ManObj(p,iVar1);
    *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
  }
  iVar1 = Gia_ManObjNum(p);
  pMap_00 = (int *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p);
  memset(pMap_00,0xff,(long)iVar1 << 2);
  pMap._4_4_ = p->nObjs;
  while( true ) {
    pMap._4_4_ = pMap._4_4_ + -1;
    bVar6 = false;
    if (-1 < pMap._4_4_) {
      _Entry = Gia_ManObj(p,pMap._4_4_);
      bVar6 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    if ((*(ulong *)_Entry >> 0x1e & 1) != 0) {
      *(ulong *)_Entry = *(ulong *)_Entry & 0xffffffffbfffffff;
      pMap_00[pMap._4_4_] = local_4c;
      local_4c = local_4c + 1;
    }
  }
  for (pMap._4_4_ = 0; iVar1 = Vec_IntSize(vLits), pMap._4_4_ < iVar1; pMap._4_4_ = pMap._4_4_ + 1)
  {
    iVar1 = Vec_IntEntry(vLits,pMap._4_4_);
    iVar1 = Abc_Lit2LitV(pMap_00,iVar1);
    Vec_IntWriteEntry(vLits,pMap._4_4_,iVar1);
  }
  pCVar3 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar3->pMan = (Aig_Man_t *)p;
  pCVar3->nVars = local_4c;
  iVar1 = Vec_IntSize(vLits);
  pCVar3->nLiterals = iVar1;
  iVar1 = Vec_IntSize(vClas);
  pCVar3->nClauses = iVar1;
  ppiVar4 = (int **)malloc((long)(pCVar3->nClauses + 1) << 3);
  pCVar3->pClauses = ppiVar4;
  piVar5 = Vec_IntReleaseArray(vLits);
  *pCVar3->pClauses = piVar5;
  for (pMap._4_4_ = 0; iVar1 = Vec_IntSize(vClas), pMap._4_4_ < iVar1; pMap._4_4_ = pMap._4_4_ + 1)
  {
    iVar1 = Vec_IntEntry(vClas,pMap._4_4_);
    pCVar3->pClauses[pMap._4_4_] = *pCVar3->pClauses + iVar1;
  }
  pCVar3->pClauses[pMap._4_4_] = *pCVar3->pClauses + pCVar3->nLiterals;
  pCVar3->pVarNums = pMap_00;
  return pCVar3;
}

Assistant:

Cnf_Dat_t * Jf_ManCreateCnfRemap( Gia_Man_t * p, Vec_Int_t * vLits, Vec_Int_t * vClas, int fAddOrCla )
{
    Cnf_Dat_t * pCnf; 
    Gia_Obj_t * pObj;
    int i, Entry, * pMap, nVars = 0;
    if ( fAddOrCla )
    {
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vLits, Abc_Var2Lit(Gia_ObjId(p, pObj), 0) );
    }
    // label nodes present in the mapping
    Vec_IntForEachEntry( vLits, Entry, i )
        Gia_ManObj(p, Abc_Lit2Var(Entry))->fMark0 = 1;
    // create variable map
    pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObjReverse( p, pObj, i )
        if ( pObj->fMark0 )
            pObj->fMark0 = 0, pMap[i] = nVars++;
    // relabel literals
    Vec_IntForEachEntry( vLits, Entry, i )
        Vec_IntWriteEntry( vLits, i, Abc_Lit2LitV(pMap, Entry) );
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = (Aig_Man_t *)p;
    pCnf->nVars = nVars;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->nClauses = Vec_IntSize(vClas);
    pCnf->pClauses = ABC_ALLOC( int *, pCnf->nClauses+1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[i] = pCnf->pClauses[0] + pCnf->nLiterals;
    pCnf->pVarNums = pMap;
    return pCnf;
}